

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void GenerateOutputControlFontFamily(utf16 *pchFontName,utf16 *pchOutputName)

{
  unsigned_short *__result;
  wchar_t *__last;
  wstring stu;
  wchar_t rgchw [120];
  wchar_t *in_stack_fffffffffffffdb0;
  unsigned_short *in_stack_fffffffffffffdb8;
  wchar_t *__first;
  allocator local_219;
  wstring local_218 [32];
  wchar_t local_1f8 [126];
  
  __first = local_1f8;
  std::copy<unsigned_short*,wchar_t*>
            ((unsigned_short *)__first,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_218,__first,&local_219);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_219);
  std::__cxx11::wstring::append((wchar_t *)local_218);
  __result = (unsigned_short *)std::__cxx11::wstring::data();
  __last = (wchar_t *)std::__cxx11::wstring::data();
  std::__cxx11::wstring::length();
  std::copy<wchar_t_const*,unsigned_short*>(__first,__last,__result);
  std::__cxx11::wstring::~wstring(local_218);
  return;
}

Assistant:

void GenerateOutputControlFontFamily(utf16 * pchFontName, utf16 * pchOutputName)
{
	wchar_t rgchw[120];
	std::copy(pchFontName, pchFontName + 120, rgchw);
	std::wstring stu(rgchw);
	stu.append(L" Graphite");
	std::copy(stu.data(), stu.data() + stu.length() + 1, pchOutputName);
	//utf16cpy(pchOutputName, (const utf16*)stu.Chars());
	//pchOutputName[stu.Length() + 1] = 0;
}